

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::Connection::~Connection(Connection *this)

{
  Connection *this_local;
  
  ~Connection(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

Connection (CodeLocation l) : Object (std::move (l)) {}